

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

bool __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>::insert_media
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false> *this,Media *media)

{
  pointer psVar1;
  pointer pSVar2;
  element_type *peVar3;
  MemorySlotHandler *pMVar4;
  pointer psVar5;
  pointer psVar6;
  MemorySlot *this_00;
  long lVar7;
  MemorySlotHandler *pMVar8;
  DiskROM *this_01;
  ulong length;
  undefined **ppuVar9;
  ulong uVar10;
  pointer psVar11;
  size_t drive;
  shared_ptr<Storage::Disk::Disk> local_50;
  shared_ptr<Storage::Tape::Tape> local_40;
  
  psVar1 = (media->cartridges).
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 == (media->cartridges).
                super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto switchD_0034ff8e_default;
  pSVar2 = (((psVar1->super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>)
            ._M_ptr)->segments_).
           super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = PrimarySlot::subslot(&this->memory_slots_[1].super_PrimarySlot,0);
  MemorySlot::set_source(this_00,&pSVar2->data);
  uVar10 = (long)(pSVar2->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           *(long *)&(pSVar2->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  length = 0x10000 - pSVar2->start_address;
  if (uVar10 <= length) {
    length = uVar10;
  }
  MemorySlot::map<(MSX::MemorySlot::AccessType)0>(this_00,0,(uint16_t)pSVar2->start_address,length);
  peVar3 = (((media->cartridges).
             super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar3 == (element_type *)0x0) ||
     (lVar7 = __dynamic_cast(peVar3,&Storage::Cartridge::Cartridge::typeinfo,
                             &Analyser::Static::MSX::Cartridge::typeinfo,0), lVar7 == 0))
  goto switchD_0034ff8e_default;
  switch(*(undefined4 *)(lVar7 + 0x20)) {
  case 1:
    pMVar8 = (MemorySlotHandler *)operator_new(0x20);
    (pMVar8->confidence_counter_).super_ConfidenceSource._vptr_ConfidenceSource =
         (_func_int **)&PTR_get_confidence_0058c890;
    (pMVar8->confidence_counter_).hits_ = 1;
    (pMVar8->confidence_counter_).misses_ = 1;
    ppuVar9 = &PTR__MemorySlotHandler_0059a2f0;
    break;
  case 2:
    pMVar8 = (MemorySlotHandler *)operator_new(0x30);
    (pMVar8->confidence_counter_).super_ConfidenceSource._vptr_ConfidenceSource =
         (_func_int **)&PTR_get_confidence_0058c890;
    (pMVar8->confidence_counter_).hits_ = 1;
    (pMVar8->confidence_counter_).misses_ = 1;
    pMVar8->_vptr_MemorySlotHandler = (_func_int **)&PTR__MemorySlotHandler_0059a348;
    pMVar8[1]._vptr_MemorySlotHandler = (_func_int **)this_00;
    pMVar8[1].confidence_counter_.super_ConfidenceSource._vptr_ConfidenceSource =
         (_func_int **)&(this->speaker_).scc;
    *(undefined1 *)&pMVar8[1].confidence_counter_.hits_ = 0;
    goto LAB_0035006c;
  case 3:
    pMVar8 = (MemorySlotHandler *)operator_new(0x20);
    (pMVar8->confidence_counter_).super_ConfidenceSource._vptr_ConfidenceSource =
         (_func_int **)&PTR_get_confidence_0058c890;
    (pMVar8->confidence_counter_).hits_ = 1;
    (pMVar8->confidence_counter_).misses_ = 1;
    ppuVar9 = &PTR__MemorySlotHandler_0059a3a0;
    break;
  case 4:
    pMVar8 = (MemorySlotHandler *)operator_new(0x20);
    (pMVar8->confidence_counter_).super_ConfidenceSource._vptr_ConfidenceSource =
         (_func_int **)&PTR_get_confidence_0058c890;
    (pMVar8->confidence_counter_).hits_ = 1;
    (pMVar8->confidence_counter_).misses_ = 1;
    ppuVar9 = &PTR__MemorySlotHandler_0059a3f8;
    break;
  default:
    goto switchD_0034ff8e_default;
  }
  pMVar8->_vptr_MemorySlotHandler = (_func_int **)ppuVar9;
  pMVar8[1]._vptr_MemorySlotHandler = (_func_int **)this_00;
LAB_0035006c:
  pMVar4 = this->memory_slots_[1].handler._M_t.
           super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
           .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl;
  this->memory_slots_[1].handler._M_t.
  super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>._M_t.
  super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>.
  super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl = pMVar8;
  if (pMVar4 != (MemorySlotHandler *)0x0) {
    (*pMVar4->_vptr_MemorySlotHandler[1])();
  }
switchD_0034ff8e_default:
  psVar5 = (media->tapes).
           super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar5 != (media->tapes).
                super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar5->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar5->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Storage::Tape::TapePlayer::set_tape(&(this->tape_player_).super_TapePlayer,&local_40);
    if (local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  psVar11 = (media->disks).
            super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((psVar11 != psVar6) &&
      (pMVar8 = this->memory_slots_[2].handler._M_t.
                super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
                ._M_t.
                super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
                .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,
      pMVar8 != (MemorySlotHandler *)0x0)) &&
     (this_01 = (DiskROM *)__dynamic_cast(pMVar8,&MemorySlotHandler::typeinfo,&DiskROM::typeinfo,0),
     this_01 != (DiskROM *)0x0)) {
    drive = 0;
    do {
      local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar11->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (psVar11->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      DiskROM::set_disk(this_01,&local_50,drive);
      if (local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (drive == 1) break;
      drive = drive + 1;
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar6);
  }
  set_use_fast_tape(this);
  return true;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.cartridges.empty()) {
				const auto &segment = media.cartridges.front()->get_segments().front();
				auto &slot = cartridge_slot();

				slot.set_source(segment.data);
				slot.map(0, uint16_t(segment.start_address), std::min(segment.data.size(), 65536 - segment.start_address));

				auto msx_cartridge = dynamic_cast<Analyser::Static::MSX::Cartridge *>(media.cartridges.front().get());
				if(msx_cartridge) {
					switch(msx_cartridge->type) {
						default: break;
						case Analyser::Static::MSX::Cartridge::Konami:
							cartridge_primary().handler = std::make_unique<Cartridge::KonamiROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
						case Analyser::Static::MSX::Cartridge::KonamiWithSCC:
							cartridge_primary().handler = std::make_unique<Cartridge::KonamiWithSCCROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot), speaker_.scc);
						break;
						case Analyser::Static::MSX::Cartridge::ASCII8kb:
							cartridge_primary().handler = std::make_unique<Cartridge::ASCII8kbROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
						case Analyser::Static::MSX::Cartridge::ASCII16kb:
							cartridge_primary().handler = std::make_unique<Cartridge::ASCII16kbROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
					}
				}
			}

			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
			}

			if(!media.disks.empty()) {
				DiskROM *const handler = disk_handler();
				if(handler) {
					size_t drive = 0;
					for(auto &disk : media.disks) {
						handler->set_disk(disk, drive);
						drive++;
						if(drive == 2) break;
					}
				}
			}

			set_use_fast_tape();

			return true;
		}